

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void handle_token(string *v,size_t s,size_t l,list<SToken,_std::allocator<SToken>_> *tokens)

{
  size_t *psVar1;
  char *__s2;
  int iVar2;
  _List_node_base *p_Var3;
  undefined4 uVar4;
  char *local_48;
  string t;
  
  if (l != 0) {
    std::__cxx11::string::substr((ulong)&local_48,(ulong)v);
    __s2 = local_48;
    iVar2 = strcasecmp("true",local_48);
    if ((iVar2 == 0) || (iVar2 = strcasecmp("false",__s2), iVar2 == 0)) {
      p_Var3 = (_List_node_base *)operator_new(0x28);
      uVar4 = 3;
    }
    else if (*__s2 == '\'') {
      p_Var3 = (_List_node_base *)operator_new(0x28);
      uVar4 = 5;
    }
    else {
      p_Var3 = (_List_node_base *)operator_new(0x28);
      uVar4 = 4;
    }
    *(undefined4 *)&p_Var3[1]._M_next = uVar4;
    p_Var3[1]._M_prev = (_List_node_base *)s;
    p_Var3[2]._M_next = (_List_node_base *)l;
    std::__detail::_List_node_base::_M_hook(p_Var3);
    psVar1 = &(tokens->super__List_base<SToken,_std::allocator<SToken>_>)._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
    if ((size_type *)local_48 != &t._M_string_length) {
      operator_delete(local_48,t._M_string_length + 1);
    }
    return;
  }
  return;
}

Assistant:

void handle_token(const std::string& v, size_t s, size_t l, std::list<SToken>& tokens)
{
    if (0 == l)
    {
        return;
    }
    
    std::string t = v.substr(s, l);
    if (0 == strcasecmp("true", t.c_str())
        || 0 == strcasecmp("false", t.c_str()))
    {
        tokens.push_back(SToken(BOOLEAN, s, l));
    }
    else if ('\'' == t[0])
    {
        tokens.push_back(SToken(STRING, s, l));
    }
    else
    {
        tokens.push_back(SToken(NUMBER, s, l));
    }
}